

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.hpp
# Opt level: O0

void __thiscall piksel::BaseApp::BaseApp(BaseApp *this,int width,int height)

{
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  int height_local;
  int width_local;
  BaseApp *this_local;
  
  local_18 = height;
  local_14 = width;
  _height_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"piksel",&local_39);
  BaseApp(this,width,height,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

BaseApp(int width, int height) : BaseApp(width, height, "piksel") {
    }